

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Security.cpp
# Opt level: O3

void __thiscall Security::InsertNOPs(Security *this)

{
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  UINT_PTR UVar2;
  Instr *this_02;
  uint uVar3;
  undefined4 uVar4;
  
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,InsertNOPsPhase,sourceContextId,functionId);
  if (((!bVar1) &&
      (bVar1 = Js::ConfigFlagsTable::IsEnabled
                         ((ConfigFlagsTable *)&Js::Configuration::Global,DebugFlag), !bVar1)) &&
     (bVar1 = Js::ConfigFlagsTable::IsEnabled
                        ((ConfigFlagsTable *)&Js::Configuration::Global,BenchmarkFlag),
     uVar4 = DAT_015a4e84, !bVar1)) {
    this_02 = this->func->m_headInstr;
    UVar2 = Math::Rand();
    if (this_02 != (Instr *)0x0) {
      do {
        uVar3 = ~(-1 << ((byte)uVar4 & 0x1f)) & (uint)UVar2;
        do {
          this_02 = IR::Instr::GetNextRealInstr(this_02);
          bVar1 = uVar3 != 0;
          uVar3 = uVar3 - 1;
          if (this_02 == (Instr *)0x0) break;
        } while (bVar1);
        if (this_02 == (Instr *)0x0) {
          return;
        }
        UVar2 = Math::Rand();
        InsertSmallNOP(this_02,((uint)UVar2 & 3) + 1);
        uVar4 = DAT_015a4e84;
        UVar2 = Math::Rand();
      } while( true );
    }
  }
  return;
}

Assistant:

void
Security::InsertNOPs()
{
    if (PHASE_OFF(Js::InsertNOPsPhase, this->func) || CONFIG_ISENABLED(Js::DebugFlag) || CONFIG_ISENABLED(Js::BenchmarkFlag))
    {
        return;
    }

    int count = 0;
    IR::Instr *instr = this->func->m_headInstr;

    while (true)
    {
        count = this->GetNextNOPInsertPoint();
        while (instr && count--)
        {
            instr = instr->GetNextRealInstr();
        }
        if (instr == nullptr)
        {
            break;
        }
        this->InsertNOPBefore(instr);
    };
}